

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool IsLiveAt(VmInstruction *inst,VmInstruction *point)

{
  VmBlock *pVVar1;
  bool bVar2;
  VmInstruction **ppVVar3;
  VmValue **ppVVar4;
  uint i;
  uint uVar5;
  uint index;
  
  pVVar1 = point->parent;
  if (pVVar1 == inst->parent) {
    bVar2 = IsAfter(inst,point);
    uVar5 = 0;
    index = 0;
    if (bVar2) goto LAB_001a6877;
    do {
      if ((pVVar1->liveOut).count <= uVar5) goto LAB_001a68dd;
      ppVVar3 = SmallArray<VmInstruction_*,_4U>::operator[](&pVVar1->liveOut,uVar5);
      uVar5 = uVar5 + 1;
    } while (*ppVVar3 != inst);
  }
  else {
    uVar5 = 0;
    do {
      if ((pVVar1->liveIn).count <= uVar5) {
        index = 0;
        goto LAB_001a6877;
      }
      ppVVar3 = SmallArray<VmInstruction_*,_4U>::operator[](&pVVar1->liveIn,uVar5);
      uVar5 = uVar5 + 1;
    } while (*ppVVar3 != inst);
    uVar5 = 0;
    do {
      if ((pVVar1->liveOut).count <= uVar5) goto LAB_001a68ab;
      ppVVar3 = SmallArray<VmInstruction_*,_4U>::operator[](&pVVar1->liveOut,uVar5);
      uVar5 = uVar5 + 1;
    } while (*ppVVar3 != inst);
  }
LAB_001a6870:
  index = 1;
  goto LAB_001a6877;
LAB_001a68dd:
  for (; index = 0, point != (VmInstruction *)0x0; point = point->nextSibling) {
    while (index < (point->arguments).count) {
      ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&point->arguments,index);
      index = index + 1;
      if ((VmInstruction *)*ppVVar4 == inst) goto LAB_001a6870;
    }
  }
  goto LAB_001a6877;
LAB_001a68ab:
  for (; index = 0, point != (VmInstruction *)0x0; point = point->nextSibling) {
    while (index < (point->arguments).count) {
      ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&point->arguments,index);
      index = index + 1;
      if ((VmInstruction *)*ppVVar4 == inst) goto LAB_001a6870;
    }
  }
LAB_001a6877:
  return SUB41(index,0);
}

Assistant:

bool IsLiveAt(VmInstruction *inst, VmInstruction *point)
{
	VmBlock *definitionBlock = inst->parent;

	VmBlock *pointBlock = point->parent;

	// If both instructions are in the same block
	if(pointBlock == definitionBlock)
	{
		// If definition is after the point, then it's not live yet
		if(IsAfter(inst, point))
			return false;

		// If definition is before the point, we must find out if it's live yet

		// If it's live-out, then it's live at point
		for(unsigned i = 0; i < pointBlock->liveOut.size(); i++)
		{
			if(pointBlock->liveOut[i] == inst)
				return true;
		}

		// Check if it's used at point or after it
		VmInstruction *curr = point;

		while(curr)
		{
			for(unsigned i = 0; i < curr->arguments.size(); i++)
			{
				if(curr->arguments[i] == inst)
					return true;
			}

			curr = curr->nextSibling;
		}
	}
	else
	{
		// If instruction is not live-in at point block then it's not live
		bool liveIn = false;

		for(unsigned i = 0; i < pointBlock->liveIn.size(); i++)
		{
			if(pointBlock->liveIn[i] == inst)
			{
				liveIn = true;
				break;
			}
		}

		if(liveIn)
		{
			// If it's live-out, then it's live at point
			for(unsigned i = 0; i < pointBlock->liveOut.size(); i++)
			{
				if(pointBlock->liveOut[i] == inst)
					return true;
			}

			// Check if it's used at point or after it
			VmInstruction *curr = point;

			while(curr)
			{
				for(unsigned i = 0; i < curr->arguments.size(); i++)
				{
					if(curr->arguments[i] == inst)
						return true;
				}

				curr = curr->nextSibling;
			}
		}
	}

	return false;
}